

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

int JS_IteratorClose(JSContext *ctx,JSValue enum_obj,BOOL is_exception_pending)

{
  JSRuntime *pJVar1;
  void *pvVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  JSValue JVar8;
  ulong local_48;
  int64_t local_40;
  
  if (is_exception_pending == 0) {
    local_40 = 3;
    iVar4 = 0;
    local_48 = 0;
    uVar7 = 0;
  }
  else {
    pJVar1 = ctx->rt;
    pvVar2 = (pJVar1->current_exception).u.ptr;
    local_40 = (pJVar1->current_exception).tag;
    uVar7 = (ulong)pvVar2 & 0xffffffff00000000;
    (pJVar1->current_exception).u.int32 = 0;
    (pJVar1->current_exception).tag = 2;
    local_48 = (ulong)pvVar2 & 0xffffffff;
    iVar4 = -1;
  }
  JVar8 = JS_GetPropertyInternal(ctx,enum_obj,6,enum_obj,0);
  iVar3 = (int)JVar8.tag;
  iVar5 = iVar4;
  if (((iVar3 != 2) && (iVar3 != 3)) && (iVar5 = -1, iVar3 != 6)) {
    JVar8 = JS_CallFree(ctx,JVar8,enum_obj,0,(JSValue *)0x0);
    uVar6 = (uint)JVar8.tag;
    iVar5 = iVar4;
    if (((is_exception_pending == 0) && (uVar6 != 0xffffffff)) && (iVar5 = -1, uVar6 != 6)) {
      JS_ThrowTypeError(ctx,"not an object");
    }
    if ((0xfffffff4 < uVar6) && (iVar4 = *JVar8.u.ptr, *(int *)JVar8.u.ptr = iVar4 + -1, iVar4 < 2))
    {
      __JS_FreeValueRT(ctx->rt,JVar8);
    }
  }
  if (is_exception_pending != 0) {
    JVar8.tag = local_40;
    JVar8.u.ptr = (void *)(uVar7 | local_48);
    JS_Throw(ctx,JVar8);
  }
  return iVar5;
}

Assistant:

static int JS_IteratorClose(JSContext *ctx, JSValueConst enum_obj,
                            BOOL is_exception_pending)
{
    JSValue method, ret, ex_obj;
    int res;

    if (is_exception_pending) {
        ex_obj = ctx->rt->current_exception;
        ctx->rt->current_exception = JS_NULL;
        res = -1;
    } else {
        ex_obj = JS_UNDEFINED;
        res = 0;
    }
    method = JS_GetProperty(ctx, enum_obj, JS_ATOM_return);
    if (JS_IsException(method)) {
        res = -1;
        goto done;
    }
    if (JS_IsUndefined(method) || JS_IsNull(method)) {
        goto done;
    }
    ret = JS_CallFree(ctx, method, enum_obj, 0, NULL);
    if (!is_exception_pending) {
        if (JS_IsException(ret)) {
            res = -1;
        } else if (!JS_IsObject(ret)) {
            JS_ThrowTypeErrorNotAnObject(ctx);
            res = -1;
        }
    }
    JS_FreeValue(ctx, ret);
 done:
    if (is_exception_pending) {
        JS_Throw(ctx, ex_obj);
    }
    return res;
}